

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_enc.c
# Opt level: O2

void VP8WriteProbas(VP8BitWriter *bw,VP8EncProba *probas)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint8_t (*pauVar7) [11];
  uint8_t (*pauVar8) [11];
  uint8_t (*pauVar9) [11];
  uint8_t (*pauVar10) [11];
  ProbaArray (*paaauVar11) [8];
  uint8_t (*local_80) [11];
  uint8_t (*local_78) [11];
  ProbaArray (*local_70) [8];
  ProbaArray (*local_68) [8];
  
  local_70 = probas->coeffs_;
  local_78 = (uint8_t (*) [11])VP8CoeffsProba0;
  local_80 = (uint8_t (*) [11])VP8CoeffsUpdateProba;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    local_68 = local_70;
    pauVar7 = local_78;
    pauVar9 = local_80;
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      pauVar8 = pauVar7;
      pauVar10 = pauVar9;
      paaauVar11 = local_68;
      for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
        for (lVar6 = 0; lVar6 != 0xb; lVar6 = lVar6 + 1) {
          bVar1 = (*paaauVar11)[0][0][lVar6];
          iVar2 = VP8PutBit(bw,(uint)(bVar1 != (*(uint8_t (*) [3] [11])*pauVar8)[0][lVar6]),
                            (uint)(*(uint8_t (*) [3] [11])*pauVar10)[0][lVar6]);
          if (iVar2 != 0) {
            VP8PutBits(bw,(uint)bVar1,8);
          }
        }
        paaauVar11 = (ProbaArray (*) [8])((*paaauVar11)[0] + 1);
        pauVar8 = pauVar8 + 1;
        pauVar10 = pauVar10 + 1;
      }
      local_68 = (ProbaArray (*) [8])(*local_68 + 1);
      pauVar7 = pauVar7 + 3;
      pauVar9 = pauVar9 + 3;
    }
    local_70 = local_70 + 1;
    local_78 = local_78 + 0x18;
    local_80 = local_80 + 0x18;
  }
  iVar2 = VP8PutBitUniform(bw,probas->use_skip_proba_);
  if (iVar2 != 0) {
    VP8PutBits(bw,(uint)probas->skip_proba_,8);
    return;
  }
  return;
}

Assistant:

void VP8WriteProbas(VP8BitWriter* const bw, const VP8EncProba* const probas) {
  int t, b, c, p;
  for (t = 0; t < NUM_TYPES; ++t) {
    for (b = 0; b < NUM_BANDS; ++b) {
      for (c = 0; c < NUM_CTX; ++c) {
        for (p = 0; p < NUM_PROBAS; ++p) {
          const uint8_t p0 = probas->coeffs_[t][b][c][p];
          const int update = (p0 != VP8CoeffsProba0[t][b][c][p]);
          if (VP8PutBit(bw, update, VP8CoeffsUpdateProba[t][b][c][p])) {
            VP8PutBits(bw, p0, 8);
          }
        }
      }
    }
  }
  if (VP8PutBitUniform(bw, probas->use_skip_proba_)) {
    VP8PutBits(bw, probas->skip_proba_, 8);
  }
}